

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool leveldb::FindLargestKey
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               InternalKey *largest_key)

{
  pointer ppFVar1;
  pointer ppFVar2;
  size_type sVar3;
  size_type sVar4;
  int iVar5;
  pointer ppFVar6;
  InternalKey *__str;
  ulong uVar7;
  long in_FS_OFFSET;
  pointer local_58;
  size_type local_50;
  pointer local_48;
  size_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppFVar1 = (files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar1 != ppFVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&largest_key->rep_,&((*ppFVar1)->largest).rep_);
    ppFVar6 = (files->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(files->
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6)) {
      uVar7 = 1;
      do {
        sVar3 = (ppFVar6[uVar7]->largest).rep_._M_string_length;
        if (sVar3 == 0) {
LAB_00d1d194:
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        __str = &ppFVar6[uVar7]->largest;
        local_48 = (__str->rep_)._M_dataplus._M_p;
        sVar4 = (largest_key->rep_)._M_string_length;
        local_40 = sVar3;
        if (sVar4 == 0) goto LAB_00d1d194;
        local_58 = (largest_key->rep_)._M_dataplus._M_p;
        local_50 = sVar4;
        iVar5 = (*(icmp->super_Comparator)._vptr_Comparator[2])(icmp,&local_48,&local_58);
        if (0 < iVar5) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&largest_key->rep_,&__str->rep_);
        }
        uVar7 = uVar7 + 1;
        ppFVar6 = (files->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(files->
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >>
                              3));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return ppFVar1 != ppFVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FindLargestKey(const InternalKeyComparator& icmp,
                    const std::vector<FileMetaData*>& files,
                    InternalKey* largest_key) {
  if (files.empty()) {
    return false;
  }
  *largest_key = files[0]->largest;
  for (size_t i = 1; i < files.size(); ++i) {
    FileMetaData* f = files[i];
    if (icmp.Compare(f->largest, *largest_key) > 0) {
      *largest_key = f->largest;
    }
  }
  return true;
}